

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmrandgen.cpp
# Opt level: O2

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char cVar1;
  char *__s1;
  ui32_t uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  undefined8 uStack_50;
  allocator<char> local_39;
  string *local_38;
  
  this->error_flag = true;
  this->format = OF_HEX;
  this->request_size = 0x20;
  this->no_newline_flag = false;
  this->verbose_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->size_provided = false;
  local_38 = &this->separator;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"-",&local_39);
  for (iVar6 = 1; iVar6 < argc; iVar6 = iVar6 + 1) {
    __s1 = argv[iVar6];
    iVar3 = strcmp(__s1,"-help");
    if (iVar3 == 0) {
LAB_0010fed1:
      this->help_flag = true;
    }
    else {
      if (*__s1 != '-') {
switchD_0010feeb_caseD_6f:
        fprintf(_stderr,"Unrecognized option: %s\n",__s1);
        return;
      }
      cVar1 = __s1[1];
      iVar3 = isalpha((int)cVar1);
      if ((iVar3 == 0) || (__s1[2] != '\0')) goto switchD_0010feeb_caseD_6f;
      switch(cVar1) {
      case 'n':
        this->no_newline_flag = true;
        break;
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 't':
      case 'u':
        goto switchD_0010feeb_caseD_6f;
      case 's':
        iVar6 = iVar6 + 1;
        if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
          uStack_50 = 0x73;
LAB_00110037:
          fprintf(_stderr,"Argument not found for option -%c.\n",uStack_50);
          return;
        }
        lVar4 = strtol(argv[iVar6],(char **)0x0,10);
        lVar5 = -lVar4;
        if (0 < lVar4) {
          lVar5 = lVar4;
        }
        this->request_size = (ui32_t)lVar5;
        this->size_provided = true;
        break;
      case 'v':
        this->verbose_flag = true;
        break;
      case 'w':
        this->format = OF_DICTWORD;
        break;
      case 'x':
        this->format = OF_HEX;
        break;
      default:
        if (cVar1 == 'B') {
          this->format = OF_BASE64;
        }
        else if (cVar1 == 'C') {
          this->format = OF_CODEWORD;
        }
        else if (cVar1 == 'V') {
          this->version_flag = true;
        }
        else if (cVar1 == 'W') {
          iVar6 = iVar6 + 1;
          if ((argc <= iVar6) || (*argv[iVar6] == '-')) {
            uStack_50 = 0x57;
            goto LAB_00110037;
          }
          std::__cxx11::string::assign((char *)local_38);
        }
        else {
          if (cVar1 == 'h') goto LAB_0010fed1;
          if (cVar1 == 'c') {
            this->format = OF_CSTRUCT;
          }
          else {
            if (cVar1 != 'b') goto switchD_0010feeb_caseD_6f;
            this->format = OF_BINARY;
          }
        }
      }
    }
  }
  if (this->help_flag != false) {
    return;
  }
  if (this->version_flag != false) {
    return;
  }
  if (this->size_provided == false) {
    if (this->format == OF_CODEWORD) {
      uVar2 = 0x14;
    }
    else {
      if (this->format != OF_DICTWORD) goto LAB_0010fffd;
      uVar2 = 0x10;
    }
    this->request_size = uVar2;
  }
  else if (this->request_size == 0) {
    fwrite("Please use a non-zero request size\n",0x23,1,_stderr);
    return;
  }
LAB_0010fffd:
  this->error_flag = false;
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), no_newline_flag(false), verbose_flag(false),
    version_flag(false), help_flag(false), format(OF_HEX), request_size(RandBlockSize*2),
    size_provided(false), separator("-")
  {
    for ( int i = 1; i < argc; i++ )
      {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
     
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'b': format = OF_BINARY; break;
	      case 'B': format = OF_BASE64; break;
	      case 'c': format = OF_CSTRUCT; break;
	      case 'C': format = OF_CODEWORD; break;
	      case 'n': no_newline_flag = true; break;
	      case 'h': help_flag = true; break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		request_size = Kumu::xabs(strtol(argv[i], 0, 10));
		size_provided = true;
		break;

	      case 'v': verbose_flag = true; break;
	      case 'V': version_flag = true; break;
	      case 'w': format = OF_DICTWORD; break;

	      case 'W':
		TEST_EXTRA_ARG(i, 'W');
		separator = argv[i];
		break;

	      case 'x': format = OF_HEX; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
	    return;
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( ! size_provided )
      {
	if ( format == OF_CODEWORD )
	  {
	    request_size = 20;
	  }
	else if ( format == OF_DICTWORD )
	  {
	    request_size = 16;
	  }
      }
    else if ( request_size == 0 )
      {
	fprintf(stderr, "Please use a non-zero request size\n");
	return;
      }

    error_flag = false;
  }